

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.cpp
# Opt level: O0

udword * __thiscall IceMaths::AABB::GetEdges(AABB *this)

{
  AABB *this_local;
  
  return GetEdges::Indices;
}

Assistant:

const udword* AABB::GetEdges() const
{
	static udword Indices[] = {
	0, 1,	1, 2,	2, 3,	3, 0,
	7, 6,	6, 5,	5, 4,	4, 7,
	1, 5,	6, 2,
	3, 7,	4, 0
	};
	return Indices;
}